

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_image.cpp
# Opt level: O2

uint __thiscall crnlib::dxt_image::get_pixel_alpha(dxt_image *this,uint x,uint y,uint element_index)

{
  dxt5_block *this_00;
  byte bVar1;
  byte bVar2;
  element_type eVar3;
  element *peVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ushort uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  
  uVar10 = x >> 2;
  uVar12 = y >> 2;
  eVar3 = this->m_element_type[element_index];
  if (eVar3 == cColorDXT1) {
    if (cDXT1A < this->m_format) {
      return 0xff;
    }
    peVar4 = this->m_pElements;
    uVar10 = (uVar12 * this->m_blocks_x + uVar10) * this->m_num_elements_per_block + element_index;
    if (*(ushort *)(peVar4[uVar10].m_bytes + 2) < *(ushort *)peVar4[uVar10].m_bytes) {
      return 0xff;
    }
    if ((~(peVar4[uVar10].m_bytes[(ulong)(y & 3) + 4] >> ((char)x * '\x02' & 6U)) & 3) != 0) {
      return 0xff;
    }
    return 0;
  }
  if (eVar3 != cAlphaDXT5) {
    if (eVar3 != cAlphaDXT3) {
      return 0xff;
    }
switchD_0016ea8c_default:
    uVar7 = dxt3_block::get_alpha
                      ((dxt3_block *)
                       (this->m_pElements +
                       ((uVar12 * this->m_blocks_x + uVar10) * this->m_num_elements_per_block +
                       element_index)),x & 3,y & 3,true);
    return uVar7;
  }
  this_00 = (dxt5_block *)
            (this->m_pElements +
            ((this->m_blocks_x * uVar12 + uVar10) * this->m_num_elements_per_block + element_index))
  ;
  bVar1 = this_00->m_endpoints[0];
  bVar2 = this_00->m_endpoints[1];
  uVar7 = dxt5_block::get_selector(this_00,x & 3,y & 3);
  uVar8 = (uint)bVar1;
  uVar11 = (uint)bVar2;
  uVar5 = (uint)bVar1;
  uVar6 = (uint)bVar2;
  if (bVar2 < bVar1) {
    switch(uVar7) {
    case 0:
      goto LAB_0016eb6b;
    case 1:
      goto LAB_0016eb6b;
    case 2:
      uVar8 = uVar8 * 6 + uVar11;
      break;
    case 3:
      uVar8 = uVar5 * 5 + uVar6 * 2;
      break;
    case 4:
      uVar8 = uVar11 * 3 + uVar8 * 4;
      break;
    case 5:
      uVar8 = uVar5 * 3 + uVar6 * 4;
      break;
    case 6:
      uVar8 = uVar11 * 5 + uVar8 * 2;
      break;
    case 7:
      uVar8 = uVar11 * 6 + uVar8;
      break;
    default:
      goto switchD_0016ea8c_default;
    }
    uVar9 = 7;
  }
  else {
    switch(uVar7) {
    case 0:
LAB_0016eb6b:
      return uVar8;
    case 1:
LAB_0016eb6b:
      return uVar11;
    case 2:
      uVar8 = uVar6 + uVar8 * 4;
      break;
    case 3:
      uVar8 = uVar5 * 3 + uVar6 * 2;
      break;
    case 4:
      uVar8 = uVar11 + uVar6 * 2 + uVar8 * 2;
      break;
    case 5:
      uVar8 = uVar5 + uVar6 * 4;
      break;
    case 6:
      return 0;
    case 7:
      return 0xff;
    default:
      goto switchD_0016ea8c_default;
    }
    uVar9 = 5;
  }
  return uVar8 / uVar9;
}

Assistant:

uint dxt_image::get_pixel_alpha(uint x, uint y, uint element_index) const
    {
        CRNLIB_ASSERT((x < m_width) && (y < m_height) && (element_index < m_num_elements_per_block));

        const uint block_x = x >> cDXTBlockShift;
        const uint block_y = y >> cDXTBlockShift;

        switch (m_element_type[element_index])
        {
        case cColorDXT1:
        {
            if (m_format <= cDXT1A)
            {
                const dxt1_block* pBlock = reinterpret_cast<const dxt1_block*>(&get_element(block_x, block_y, element_index));

                const uint l = pBlock->get_low_color();
                const uint h = pBlock->get_high_color();

                if (l <= h)
                {
                    uint s = pBlock->get_selector(x & 3, y & 3);

                    return (s == 3) ? 0 : 255;
                }
                else
                {
                    return 255;
                }
            }

            break;
        }
        case cAlphaDXT5:
        {
            const dxt5_block* pBlock = reinterpret_cast<const dxt5_block*>(&get_element(block_x, block_y, element_index));

            const uint l = pBlock->get_low_alpha();
            const uint h = pBlock->get_high_alpha();

            const uint s = pBlock->get_selector(x & 3, y & 3);

            if (l > h)
            {
                switch (s)
                {
                case 0:
                    return l;
                case 1:
                    return h;
                case 2:
                    return (l * 6 + h) / 7;
                case 3:
                    return (l * 5 + h * 2) / 7;
                case 4:
                    return (l * 4 + h * 3) / 7;
                case 5:
                    return (l * 3 + h * 4) / 7;
                case 6:
                    return (l * 2 + h * 5) / 7;
                case 7:
                    return (l + h * 6) / 7;
                }
            }
            else
            {
                switch (s)
                {
                case 0:
                    return l;
                case 1:
                    return h;
                case 2:
                    return (l * 4 + h) / 5;
                case 3:
                    return (l * 3 + h * 2) / 5;
                case 4:
                    return (l * 2 + h * 3) / 5;
                case 5:
                    return (l + h * 4) / 5;
                case 6:
                    return 0;
                case 7:
                    return 255;
                }
            }
        }
        case cAlphaDXT3:
        {
            const dxt3_block* pBlock = reinterpret_cast<const dxt3_block*>(&get_element(block_x, block_y, element_index));

            return pBlock->get_alpha(x & 3, y & 3, true);
        }
        default:
            break;
        }

        return 255;
    }